

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool operator!=(ON_MappingTag *lhs,ON_MappingTag *rhs)

{
  bool bVar1;
  int iVar2;
  
  if (lhs->m_mapping_type != rhs->m_mapping_type) {
    return true;
  }
  bVar1 = operator==(&lhs->m_mapping_id,&rhs->m_mapping_id);
  if (bVar1) {
    if ((lhs->m_mapping_type == no_mapping) &&
       (bVar1 = operator==(&ON_nil_uuid,&lhs->m_mapping_id), bVar1)) {
      return false;
    }
    if ((lhs->m_mapping_type == srfp_mapping) &&
       (bVar1 = operator==(&ON_MappingTag::SurfaceParameterMapping.m_mapping_id,&lhs->m_mapping_id),
       bVar1)) {
      bVar1 = lhs->m_mapping_crc == rhs->m_mapping_crc;
    }
    else {
      if (lhs->m_mapping_crc != rhs->m_mapping_crc) {
        return true;
      }
      iVar2 = ON_Xform::Compare(&lhs->m_mesh_xform,&rhs->m_mesh_xform);
      bVar1 = iVar2 == 0;
    }
    return !bVar1;
  }
  return true;
}

Assistant:

bool operator!=(const ON_MappingTag& lhs, const ON_MappingTag& rhs)
{
  if (lhs.m_mapping_type != rhs.m_mapping_type || false == (lhs.m_mapping_id == rhs.m_mapping_id))
    return true;

  if (ON_TextureMapping::TYPE::no_mapping == lhs.m_mapping_type && ON_nil_uuid == lhs.m_mapping_id)
  {
    // m_mapping_crc and m_mesh_xform are meaningless and are ignored
    return false;
  }

  if (ON_TextureMapping::TYPE::srfp_mapping == lhs.m_mapping_type && ON_MappingTag::SurfaceParameterMapping.m_mapping_id == lhs.m_mapping_id)
  {
    // m_mesh_xform is meaningless and is ignored
    // (m_mapping_crc can be from a uvw texture coordinate transformation and must be checked)
    return lhs.m_mapping_crc != rhs.m_mapping_crc;
  }

  return (lhs.m_mapping_crc != rhs.m_mapping_crc || 0 != lhs.m_mesh_xform.Compare(rhs.m_mesh_xform));
}